

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evp_asn1.cc
# Opt level: O0

size_t num_elements(uint8_t *in,size_t in_len)

{
  int iVar1;
  size_t sVar2;
  uint8_t *local_48;
  size_t count;
  CBS sequence;
  CBS cbs;
  size_t in_len_local;
  uint8_t *in_local;
  
  CBS_init((CBS *)&sequence.len,in,in_len);
  iVar1 = CBS_get_asn1((CBS *)&sequence.len,(CBS *)&count,0x20000010);
  if (iVar1 == 0) {
    in_local = (uint8_t *)0x0;
  }
  else {
    local_48 = (uint8_t *)0x0;
    while (sVar2 = CBS_len((CBS *)&count), sVar2 != 0) {
      iVar1 = CBS_get_any_asn1_element((CBS *)&count,(CBS *)0x0,(CBS_ASN1_TAG *)0x0,(size_t *)0x0);
      if (iVar1 == 0) {
        return 0;
      }
      local_48 = local_48 + 1;
    }
    in_local = local_48;
  }
  return (size_t)in_local;
}

Assistant:

static size_t num_elements(const uint8_t *in, size_t in_len) {
  CBS cbs, sequence;
  CBS_init(&cbs, in, (size_t)in_len);

  if (!CBS_get_asn1(&cbs, &sequence, CBS_ASN1_SEQUENCE)) {
    return 0;
  }

  size_t count = 0;
  while (CBS_len(&sequence) > 0) {
    if (!CBS_get_any_asn1_element(&sequence, NULL, NULL, NULL)) {
      return 0;
    }

    count++;
  }

  return count;
}